

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int hashFunction(string *word)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  __type _Var4;
  undefined4 local_18;
  undefined4 local_14;
  int i;
  int result;
  string *word_local;
  
  local_14 = 0;
  local_18 = 0;
  while( true ) {
    uVar2 = std::__cxx11::string::size();
    if (uVar2 <= (ulong)(long)local_18) break;
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)word);
    cVar1 = *pcVar3;
    _Var4 = std::pow<int,int>(4,local_18);
    local_14 = (int)((double)(int)cVar1 * _Var4 + (double)local_14);
    local_18 = local_18 + 1;
  }
  return local_14;
}

Assistant:

int hashFunction(string word) {
    int result = 0;
    for (int i = 0; i < word.size(); ++i) {
        result += word[i] * pow(4, i);
    }
    return result;
}